

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

ListBuilder * __thiscall
capnp::_::OrphanBuilder::asStructList
          (ListBuilder *__return_storage_ptr__,OrphanBuilder *this,StructSize elementSize)

{
  SegmentBuilder *origSegment;
  CapTableBuilder *capTable;
  bool bVar1;
  WirePointer *pWVar2;
  BuilderArena *orphanArena;
  word *pwVar3;
  Fault local_48;
  Fault f;
  undefined1 local_38 [8];
  DebugComparison<bool,_bool> _kjCondition;
  OrphanBuilder *this_local;
  StructSize elementSize_local;
  
  _kjCondition._24_8_ = this;
  pWVar2 = tagAsPtr(this);
  f.exception._6_1_ = WirePointer::isNull(pWVar2);
  f.exception._7_1_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(bool *)((long)&f.exception + 6));
  f.exception._5_1_ = this->location == (word *)0x0;
  kj::_::DebugExpression<bool>::operator==
            ((DebugComparison<bool,_bool> *)local_38,
             (DebugExpression<bool> *)((long)&f.exception + 7),(bool *)((long)&f.exception + 5));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_38);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<bool,bool>&>
              (&local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xe15,FAILED,"tagAsPtr()->isNull() == (location == nullptr)","_kjCondition,",
               (DebugComparison<bool,_bool> *)local_38);
    kj::_::Debug::Fault::fatal(&local_48);
  }
  pWVar2 = tagAsPtr(this);
  pwVar3 = this->location;
  origSegment = this->segment;
  capTable = this->capTable;
  orphanArena = SegmentBuilder::getArena(this->segment);
  WireHelpers::getWritableStructListPointer
            (__return_storage_ptr__,pWVar2,pwVar3,origSegment,capTable,elementSize,(word *)0x0,
             orphanArena);
  pwVar3 = ListBuilder::getLocation(__return_storage_ptr__);
  this->location = pwVar3;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder OrphanBuilder::asStructList(StructSize elementSize) {
  KJ_DASSERT(tagAsPtr()->isNull() == (location == nullptr));

  ListBuilder result = WireHelpers::getWritableStructListPointer(
      tagAsPtr(), location, segment, capTable, elementSize, nullptr, segment->getArena());

  // Watch out, the pointer could have been updated if the object had to be relocated.
  location = result.getLocation();

  return result;
}